

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamFtp::Close(BamFtp *this)

{
  TcpSocket *in_RDI;
  
  TcpSocket::DisconnectFromHost(in_RDI);
  TcpSocket::DisconnectFromHost(in_RDI);
  (in_RDI->m_errorString).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(in_RDI->m_errorString).field_2 + 8) = 0xffffffffffffffff;
  std::__cxx11::string::operator=
            ((string *)
             &(in_RDI->m_readBuffer).m_data.
              super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
              ._M_impl.super__Deque_impl_data._M_map_size,(string *)DEFAULT_USER_abi_cxx11_);
  std::__cxx11::string::operator=
            ((string *)
             &(in_RDI->m_readBuffer).m_data.
              super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node,(string *)DEFAULT_PASS_abi_cxx11_);
  std::__cxx11::string::clear();
  *(undefined2 *)&(in_RDI->m_readBuffer).m_tail = 0;
  return;
}

Assistant:

void BamFtp::Close(void) {

    // disconnect socket
    m_commandSocket->DisconnectFromHost();
    m_dataSocket->DisconnectFromHost();

    // reset state - necessary??
    m_isUrlParsed = false;
    m_filePosition = -1;
    m_username = DEFAULT_USER;
    m_password = DEFAULT_PASS;
    m_dataHostname.clear();
    m_dataPort = 0;
}